

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmgram.cpp
# Opt level: O1

void __thiscall
CVmObjGramProd::delete_marked_alts(CVmObjGramProd *this,vm_obj_id_t self,vm_obj_id_t dict)

{
  long lVar1;
  CVmObjPageEntry *pCVar2;
  long lVar3;
  char *str;
  size_t len;
  long lVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  size_t *psVar8;
  
  lVar1 = *(long *)((this->super_CVmObject).ext_ + 0x30);
  if (((dict != 0) && (G_predef_X.misc_vocab != 0)) &&
     (*(long *)((this->super_CVmObject).ext_ + 0x38) != 0)) {
    pCVar2 = G_obj_table_X.pages_[dict >> 0xc];
    uVar6 = 0;
    do {
      lVar3 = *(long *)(lVar1 + uVar6 * 8);
      if ((*(int *)(lVar3 + 8) != 0) && (*(long *)(lVar3 + 0x18) != 0)) {
        psVar8 = (size_t *)(*(long *)(lVar3 + 0x10) + 0x10);
        uVar7 = 0;
        do {
          if (*(char *)((long)psVar8 + -0xe) == '\x03') {
            str = (char *)psVar8[-1];
            len = *psVar8;
            iVar5 = find_literal_in_alts(this,str,len);
            if (iVar5 == 0) {
              CVmObjDict::del_word
                        ((CVmObjDict *)((long)&pCVar2->ptr_ + (ulong)((dict & 0xfff) * 0x18)),dict,
                         str,len,self,G_predef_X.misc_vocab);
            }
          }
          uVar7 = uVar7 + 1;
          psVar8 = psVar8 + 4;
        } while (uVar7 < *(ulong *)(lVar3 + 0x18));
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 < *(ulong *)((this->super_CVmObject).ext_ + 0x38));
  }
  uVar6 = *(ulong *)((this->super_CVmObject).ext_ + 0x38);
  do {
    do {
      if (uVar6 == 0) {
        check_circular_refs(this,self);
        return;
      }
      lVar3 = *(long *)(lVar1 + -8 + uVar6 * 8);
      uVar6 = uVar6 - 1;
    } while (*(int *)(lVar3 + 8) == 0);
    *(undefined4 *)(lVar3 + 8) = 0;
    if (uVar6 != 0) {
      uVar7 = 0;
      do {
        lVar4 = *(long *)(lVar1 + uVar7 * 8);
        if ((*(int *)(lVar4 + 8) != 0) && (*(int *)(lVar4 + 0xc) == *(int *)(lVar3 + 0xc)))
        goto LAB_00266b32;
        uVar7 = uVar7 + 1;
      } while (uVar7 < uVar6);
    }
    build_alt_props(this,*(vm_obj_id_t *)(lVar3 + 0xc));
LAB_00266b32:
    delete_alt_undo(this,self,(int)uVar6);
  } while( true );
}

Assistant:

void CVmObjGramProd::delete_marked_alts(
    VMG_ vm_obj_id_t self, vm_obj_id_t dict)
{
    /* get the alt list */
    vmgram_alt_info **alts = get_ext()->alts_;

    /* if there's a dictionary, delete the words that are no longer in use */
    if (dict != VM_INVALID_OBJ
        && G_predef->misc_vocab != VM_INVALID_PROP)
    {
        /* get the dictionary object, properly cast */
        CVmObjDict *dictp = (CVmObjDict *)vm_objp(vmg_ dict);

        /* run through the alternatives being deleted */
        for (size_t i = 0 ; i < get_ext()->alt_cnt_ ; ++i)
        {
            /* get this item */
            vmgram_alt_info *alt = alts[i];

            /* if it's not being deleted, skip it */
            if (!alt->del)
                continue;

            /* run through its token list looking for literals */
            vmgram_tok_info *tok = alt->toks;
            for (size_t j = 0 ; j < alt->tok_cnt ; ++j, ++tok)
            {
                /* 
                 *   if it's a literal, and it's not defined in a surviving
                 *   alternative, delete it from the dictionary 
                 */
                if (tok->typ == VMGRAM_MATCH_LITERAL
                    && !find_literal_in_alts(
                        tok->typinfo.lit.str,tok->typinfo.lit.len))
                {
                    /* it's no longer used - remove it from the dictionary */
                    dictp->del_word(
                        vmg_ dict, tok->typinfo.lit.str, tok->typinfo.lit.len,
                        self, G_predef->misc_vocab);
                }
            }
        }
    }

    /* 
     *   Perform the deletions.  Work backwards from the end of the array to
     *   avoid overhead closing gaps in the array. 
     */
    for (size_t i = get_ext()->alt_cnt_ ; i > 0 ; )
    {
        /* get the next item */
        vmgram_alt_info *alt = alts[--i];

        /* if it's marked for deletion, delete it */
        if (alt->del)
        {
            /* unmark it, in case we later restore it via undo */
            alt->del = FALSE;

            /* 
             *   If this is the only remaining alternative with the same
             *   match object that's being deleted, rebuild the match
             *   object's grammarAltProps list.  If there's another
             *   alternative yet to be deleted that uses the same match
             *   object, don't bother doing the rebuild now, since we'll do
             *   it again when the loop reaches the earlier alternative, and
             *   we only need to do it once for the whole batch.  
             */
            int rebuild = TRUE;
            for (size_t j = 0 ; j < i ; ++j)
            {
                /* 
                 *   if this one's being deleted, and it has the same match
                 *   object, skip the rebuild now since we'll do it when we
                 *   get to 'j' in the main loop 
                 */
                if (alts[j]->del && alts[j]->proc_obj == alt->proc_obj)
                {
                    rebuild = FALSE;
                    break;
                }
            }

            /* do the rebuild if this is our last chance */
            if (rebuild)
                build_alt_props(vmg_ alt->proc_obj);

            /* delete it */
            delete_alt_undo(vmg_ self, i);
        }
    }

    /* check for circular references */
    check_circular_refs(self);
}